

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O2

void nvrm_device_set_pb_pointer_found(gpu_object *obj,_Bool pb_pointer_found)

{
  gpu_object *dev;
  nvrm_device *pnVar1;
  
  dev = nvrm_get_device(obj);
  if (dev == (gpu_object *)0x0) {
    __assert_fail("dev",
                  "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/demmt/nvrm.c"
                  ,0x115,"void nvrm_device_set_pb_pointer_found(struct gpu_object *, _Bool)");
  }
  pnVar1 = nvrm_dev(dev);
  if (pnVar1 == (nvrm_device *)0x0) {
    nvrm_get_chipset(obj);
    pnVar1 = nvrm_dev(dev);
    if (pnVar1 == (nvrm_device *)0x0) {
      __assert_fail("ndev",
                    "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/demmt/nvrm.c"
                    ,0x11b,"void nvrm_device_set_pb_pointer_found(struct gpu_object *, _Bool)");
    }
  }
  pnVar1->pb_pointer_found = pb_pointer_found;
  return;
}

Assistant:

void nvrm_device_set_pb_pointer_found(struct gpu_object *obj, bool pb_pointer_found)
{
	struct gpu_object *dev = nvrm_get_device(obj);

	assert(dev);
	struct nvrm_device *ndev = nvrm_dev(dev);
	if (!ndev) {
		nvrm_get_chipset(obj);
		ndev = nvrm_dev(dev);
	}
	assert(ndev);
	ndev->pb_pointer_found = pb_pointer_found;
}